

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O1

void semchecker(void)

{
  ast *paVar1;
  
  paVar1 = ast_root;
  newenv();
  paVar1 = child(paVar1,1);
  SEM_ExtDefList(paVar1);
  deleteallenv();
  return;
}

Assistant:

void semchecker() {
    SEM_Program(ast_root);
}